

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AddEnvVar
               (cmGeneratedFileStream *fout,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  cmState *this_00;
  char *pcVar1;
  char *pcVar2;
  cmake *pcVar3;
  long lVar4;
  ulong uVar5;
  ostream *poVar6;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90 [8];
  string valueToUse;
  char *cacheValue;
  allocator local_51;
  undefined1 local_50 [8];
  string cacheEntryName;
  char *envVarValue;
  cmMakefile *mf;
  cmLocalGenerator *lg_local;
  char *envVar_local;
  cmGeneratedFileStream *fout_local;
  
  this = cmLocalGenerator::GetMakefile(lg);
  cacheEntryName.field_2._8_8_ = getenv(envVar);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"CMAKE_ECLIPSE_ENVVAR_",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=((string *)local_50,envVar);
  this_00 = cmLocalGenerator::GetState(lg);
  valueToUse.field_2._8_8_ = cmState::GetInitializedCacheValue(this_00,(string *)local_50);
  std::__cxx11::string::string(local_90);
  if ((cacheEntryName.field_2._8_8_ == 0) && (valueToUse.field_2._8_8_ == 0)) {
    std::__cxx11::string::operator=(local_90,"");
  }
  else if ((cacheEntryName.field_2._8_8_ == 0) || (valueToUse.field_2._8_8_ != 0)) {
    if ((cacheEntryName.field_2._8_8_ == 0) && (valueToUse.field_2._8_8_ != 0)) {
      std::__cxx11::string::operator=(local_90,(char *)valueToUse.field_2._8_8_);
    }
    else {
      std::__cxx11::string::operator=(local_90,(char *)valueToUse.field_2._8_8_);
      lVar4 = std::__cxx11::string::find((char *)local_90,cacheEntryName.field_2._8_8_);
      if (lVar4 == -1) {
        std::__cxx11::string::operator=(local_90,(char *)cacheEntryName.field_2._8_8_);
        pcVar1 = (char *)std::__cxx11::string::c_str();
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(this,(string *)local_50,pcVar1,pcVar2,STRING,true);
        pcVar3 = cmMakefile::GetCMakeInstance(this);
        pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d8,pcVar1,&local_d9);
        cmake::SaveCache(pcVar3,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      }
    }
  }
  else {
    std::__cxx11::string::operator=(local_90,(char *)cacheEntryName.field_2._8_8_);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition(this,(string *)local_50,pcVar1,pcVar2,STRING,true);
    pcVar3 = cmMakefile::GetCMakeInstance(this);
    pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b1);
    cmake::SaveCache(pcVar3,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)fout,envVar);
    poVar6 = std::operator<<(poVar6,"=");
    poVar6 = std::operator<<(poVar6,local_90);
    std::operator<<(poVar6,"|");
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(cmGeneratedFileStream& fout,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  const char* envVarValue = getenv(envVar);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue = lg->GetState()->GetInitializedCacheValue(
                                                       cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (envVarValue==0 && cacheValue==0)
    {
    // nothing known, do nothing
    valueToUse = "";
    }
  else if (envVarValue!=0 && cacheValue==0)
    {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmState::STRING,
                           true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  else if (envVarValue==0 && cacheValue!=0)
    {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
    }
  else
    {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos)
      {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmState::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
      }
    }

  if (!valueToUse.empty())
    {
    fout << envVar << "=" << valueToUse << "|";
    }
}